

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O1

int Dch_ObjCheckSuppRed(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  int iVar1;
  
  Aig_ManIncrementTravId(p);
  Dch_ObjMarkTfi_rec(p,pRepr);
  Aig_ManIncrementTravId(p);
  iVar1 = Dch_ObjMarkTfi_rec(p,pObj);
  if (iVar1 != 0) {
    return 1;
  }
  Aig_ManIncrementTravId(p);
  iVar1 = Dch_ObjMarkTfi_rec(p,pRepr);
  return iVar1;
}

Assistant:

int Dch_ObjCheckSuppRed( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    // mark support of the representative node (pRepr)
    Aig_ManIncrementTravId( p );
    Dch_ObjMarkTfi_rec( p, pRepr );
    // detect if the new node (pObj) depends on additional variables
    Aig_ManIncrementTravId( p );
    if ( Dch_ObjMarkTfi_rec( p, pObj ) )
        return 1;//, printf( "1" );
    // detect if the representative node (pRepr) depends on additional variables
    Aig_ManIncrementTravId( p );
    if ( Dch_ObjMarkTfi_rec( p, pRepr ) )
        return 1;//, printf( "2" );
    // skip the choice if this is what is happening
    return 0;
}